

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

void __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::child_t
          (child_t<clipp::parameter,_clipp::group> *this,
          child_t<clipp::parameter,_clipp::group> *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  type tVar3;
  pointer pcVar4;
  undefined8 uVar5;
  pointer pfVar6;
  
  tVar3 = src->type_;
  this->type_ = tVar3;
  if (tVar3 != group) {
    parameter::parameter((parameter *)this,(parameter *)src);
    return;
  }
  paVar1 = &(this->m_).param.super_token<clipp::parameter>.doc_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&this->m_ = paVar1;
  pcVar4 = (src->m_).param.super_token<clipp::parameter>.doc_._M_dataplus._M_p;
  paVar2 = &(src->m_).param.super_token<clipp::parameter>.doc_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(src->m_).param.super_token<clipp::parameter>.doc_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_).param.super_token<clipp::parameter>.doc_.field_2 + 8) = uVar5;
  }
  else {
    (this->m_).param.super_token<clipp::parameter>.doc_._M_dataplus._M_p = pcVar4;
    (this->m_).param.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->m_).param.super_token<clipp::parameter>.doc_._M_string_length =
       (src->m_).param.super_token<clipp::parameter>.doc_._M_string_length;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&src->m_ = paVar2;
  (src->m_).param.super_token<clipp::parameter>.doc_._M_string_length = 0;
  *(undefined1 *)((long)&src->m_ + 0x10) = 0;
  *(undefined2 *)((long)&this->m_ + 0x20) = *(undefined2 *)((long)&src->m_ + 0x20);
  pfVar6 = (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
           super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pfVar6;
  (this->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (src->m_).param.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_).group.scoped_ = (src->m_).group.scoped_;
  *(undefined2 *)((long)&this->m_ + 0x40) = *(undefined2 *)((long)&src->m_ + 0x40);
  return;
}

Assistant:

child_t(child_t&& src) noexcept : type_{src.type_} {
            switch(type_) {
                default:
                case type::param: new(&m_)data{std::move(src.m_.param)}; break;
                case type::group: new(&m_)data{std::move(src.m_.group)}; break;
            }
        }